

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall
ADPlanner::InitializeSearchStateInfo
          (ADPlanner *this,ADState *state,ADSearchStateSpace_t *pSearchStateSpace)

{
  undefined4 uVar1;
  long in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  
  *(undefined4 *)((long)in_RSI + 0x24) = 1000000000;
  *(undefined4 *)(in_RSI + 4) = 1000000000;
  *(undefined2 *)(in_RSI + 5) = 0;
  *(undefined2 *)((long)in_RSI + 0x2a) = *(undefined2 *)(in_RDX + 0x22);
  in_RSI[7] = 0;
  *(undefined4 *)(in_RSI + 8) = 1000000000;
  *(undefined4 *)(in_RSI + 2) = 0;
  *in_RSI = 0;
  in_RSI[6] = 0;
  if (*(long *)(in_RDX + 0x28) == 0) {
    *(undefined4 *)((long)in_RSI + 0x44) = 0;
  }
  else {
    uVar1 = (**(code **)(*in_RDI + 0xd0))(in_RDI,in_RSI[3],in_RDX);
    *(undefined4 *)((long)in_RSI + 0x44) = uVar1;
  }
  return;
}

Assistant:

void ADPlanner::InitializeSearchStateInfo(ADState* state, ADSearchStateSpace_t* pSearchStateSpace)
{
    state->g = INFINITECOST;
    state->v = INFINITECOST;
    state->iterationclosed = 0;
    state->callnumberaccessed = pSearchStateSpace->callnumber;
    state->bestnextstate = NULL;
    state->costtobestnextstate = INFINITECOST;
    state->heapindex = 0;
    state->listelem[AD_INCONS_LIST_ID] = NULL;
#if DEBUG
    state->numofexpands = 0;
#endif
    state->bestpredstate = NULL;

    //compute heuristics
#if USE_HEUR
    if(pSearchStateSpace->searchgoalstate != NULL)
    state->h = ComputeHeuristic(state->MDPstate, pSearchStateSpace);
    else
    state->h = 0;
#else
    state->h = 0;
#endif
}